

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O0

string * pbrt::internal::ToString3<double>(double x,double y,double z)

{
  string *in_RDI;
  double *unaff_retaddr;
  
  StringPrintf<double&,double&,double&>((char *)x,(double *)y,(double *)z,unaff_retaddr);
  return in_RDI;
}

Assistant:

std::string internal::ToString3(T x, T y, T z) {
    if (std::is_floating_point<T>::value)
        return StringPrintf("[ %f, %f, %f ]", x, y, z);
    else
        return StringPrintf("[ %d, %d, %d ]", x, y, z);
}